

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O1

idx_t __thiscall
duckdb::ChunkVectorInfo::TemplatedGetSelVector<duckdb::TransactionVersionOperator>
          (ChunkVectorInfo *this,transaction_t start_time,transaction_t transaction_id,
          SelectionVector *sel_vector,idx_t max_count)

{
  sel_t *psVar1;
  idx_t iVar2;
  idx_t i;
  idx_t iVar3;
  
  if (this->same_inserted_id == true) {
    if (this->any_deleted == false) {
      iVar2 = 0;
      if (this->insert_id == transaction_id) {
        iVar2 = max_count;
      }
      if (this->insert_id < start_time) {
        iVar2 = max_count;
      }
      return iVar2;
    }
    if (max_count == 0 || this->insert_id != transaction_id && start_time <= this->insert_id) {
      return 0;
    }
    psVar1 = sel_vector->sel_vector;
    iVar3 = 0;
    iVar2 = 0;
    do {
      if (this->deleted[iVar3] != transaction_id && start_time <= this->deleted[iVar3]) {
        psVar1[iVar2] = (sel_t)iVar3;
        iVar2 = iVar2 + 1;
      }
      iVar3 = iVar3 + 1;
    } while (max_count != iVar3);
  }
  else if (this->any_deleted == false) {
    if (max_count == 0) {
      return 0;
    }
    psVar1 = sel_vector->sel_vector;
    iVar3 = 0;
    iVar2 = 0;
    do {
      if (this->inserted[iVar3] < start_time || this->inserted[iVar3] == transaction_id) {
        psVar1[iVar2] = (sel_t)iVar3;
        iVar2 = iVar2 + 1;
      }
      iVar3 = iVar3 + 1;
    } while (max_count != iVar3);
  }
  else {
    if (max_count == 0) {
      return 0;
    }
    psVar1 = sel_vector->sel_vector;
    iVar3 = 0;
    iVar2 = 0;
    do {
      if ((this->inserted[iVar3] < start_time || this->inserted[iVar3] == transaction_id) &&
         (this->deleted[iVar3] != transaction_id && start_time <= this->deleted[iVar3])) {
        psVar1[iVar2] = (sel_t)iVar3;
        iVar2 = iVar2 + 1;
      }
      iVar3 = iVar3 + 1;
    } while (max_count != iVar3);
  }
  return iVar2;
}

Assistant:

idx_t ChunkVectorInfo::TemplatedGetSelVector(transaction_t start_time, transaction_t transaction_id,
                                             SelectionVector &sel_vector, idx_t max_count) const {
	idx_t count = 0;
	if (same_inserted_id && !any_deleted) {
		// all tuples have the same inserted id: and no tuples were deleted
		if (OP::UseInsertedVersion(start_time, transaction_id, insert_id)) {
			return max_count;
		} else {
			return 0;
		}
	} else if (same_inserted_id) {
		if (!OP::UseInsertedVersion(start_time, transaction_id, insert_id)) {
			return 0;
		}
		// have to check deleted flag
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseDeletedVersion(start_time, transaction_id, deleted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	} else if (!any_deleted) {
		// have to check inserted flag
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseInsertedVersion(start_time, transaction_id, inserted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	} else {
		// have to check both flags
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseInsertedVersion(start_time, transaction_id, inserted[i]) &&
			    OP::UseDeletedVersion(start_time, transaction_id, deleted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	}
	return count;
}